

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ecdsa_adaptor_sig_deserialize
              (secp256k1_ge *r,secp256k1_scalar *sigr,secp256k1_scalar *sp,uchar *adaptor_sig65)

{
  int iVar1;
  undefined8 in_RAX;
  int overflow_1;
  int overflow;
  undefined8 local_28;
  
  local_28 = in_RAX;
  if (r == (secp256k1_ge *)0x0) {
LAB_00139af8:
    if (sigr != (secp256k1_scalar *)0x0) {
      secp256k1_scalar_set_b32(sigr,adaptor_sig65 + 1,(int *)((long)&local_28 + 4));
      if (local_28._4_4_ != 0) goto LAB_00139b38;
    }
    if (sp != (secp256k1_scalar *)0x0) {
      secp256k1_scalar_set_b32(sp,adaptor_sig65 + 0x21,(int *)&local_28);
      if ((int)local_28 != 0) goto LAB_00139b38;
    }
    iVar1 = 1;
  }
  else {
    iVar1 = secp256k1_dleq_deserialize_point(r,adaptor_sig65);
    if (iVar1 != 0) goto LAB_00139af8;
LAB_00139b38:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int secp256k1_ecdsa_adaptor_sig_deserialize(secp256k1_ge *r, secp256k1_scalar *sigr, secp256k1_scalar *sp, const unsigned char *adaptor_sig65) {
    /* Ensure that whenever you call this function to deserialize r you also
     * check that X fits into a sigr */
    VERIFY_CHECK((r == NULL) || (r != NULL && sigr != NULL));
    if (r != NULL) {
        if (!secp256k1_dleq_deserialize_point(r, &adaptor_sig65[0])) {
            return 0;
        }
    }
    if (sigr != NULL) {
        int overflow;
        secp256k1_scalar_set_b32(sigr, &adaptor_sig65[1], &overflow);
        if(overflow) {
            return 0;
        }
    }
    if (sp != NULL) {
        int overflow;
        secp256k1_scalar_set_b32(sp, &adaptor_sig65[33], &overflow);
        if(overflow) {
            return 0;
        }
    }
    return 1;
}